

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::analysis::DecorationManager::RemoveDecorationsFrom
          (DecorationManager *this,uint32_t id,
          function<bool_(const_spvtools::opt::Instruction_&)> *pred)

{
  __uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  this_00;
  Module *this_01;
  initializer_list<unsigned_int> init_list;
  pointer this_02;
  bool bVar1;
  bool bVar2;
  Op OVar3;
  int iVar4;
  uint32_t uVar5;
  uint index;
  pointer ppVar6;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *pvVar7;
  pointer ppVar8;
  TargetData *this_03;
  reference ppIVar9;
  size_type sVar10;
  size_type sVar11;
  Operand *pOVar12;
  Operand *pOVar13;
  __uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  *p_Var14;
  IRContext *c;
  Instruction *pIVar15;
  pointer this_04;
  iterator *piVar16;
  reference ppIVar17;
  TargetData *this_05;
  Instruction *inst_4;
  iterator __end2_3;
  iterator __begin2_3;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2_3;
  Instruction *inst_3;
  iterator __end3_1;
  iterator __begin3_1;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range3_1;
  Instruction *inst_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2_2;
  __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  local_230;
  const_iterator local_228;
  unordered_set<const_spvtools::opt::Instruction_*,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<const_spvtools::opt::Instruction_*>_>
  *local_220;
  Instruction **local_218;
  __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  local_210;
  __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  local_208;
  const_iterator local_200;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *local_1f8;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  *indirect_decorations;
  iterator_template<spvtools::opt::Instruction> local_1e8;
  iterator decoration_iter;
  uint32_t local_1d4;
  _func_int **local_1d0;
  _func_int **local_1c8;
  SmallVector<unsigned_int,_2UL> local_1c0;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_198
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> new_inst;
  Instruction *decoration_1;
  iterator __end4;
  iterator __begin4;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range4;
  uint local_14c;
  uint32_t last_operand_index;
  uint32_t i;
  uint32_t stride;
  Instruction *decoration;
  const_iterator __end3;
  const_iterator __begin3;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range3;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  *group_decorations;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
  local_110;
  iterator group_iter;
  undefined1 local_100 [4];
  uint32_t group_id;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  group_decorations_to_keep;
  Instruction *inst_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2_1;
  unordered_set<const_spvtools::opt::Instruction_*,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<const_spvtools::opt::Instruction_*>_>
  indirect_decorations_to_remove;
  Instruction *inst;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  undefined1 local_68 [7];
  bool is_group;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> insts_to_kill;
  IRContext *context;
  TargetData *decorations_info;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
  local_38;
  iterator ids_iter;
  bool was_modified;
  function<bool_(const_spvtools::opt::Instruction_&)> *pred_local;
  DecorationManager *pDStack_18;
  uint32_t id_local;
  DecorationManager *this_local;
  
  ids_iter.
  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
  ._M_cur._7_1_ = 0;
  pred_local._4_4_ = id;
  pDStack_18 = this;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>_>
       ::find(&this->id_to_decoration_insts_,(key_type *)((long)&pred_local + 4));
  decorations_info =
       (TargetData *)
       std::
       unordered_map<unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>_>
       ::end(&this->id_to_decoration_insts_);
  bVar1 = std::__detail::operator==
                    (&local_38,
                     (_Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                      *)&decorations_info);
  if (bVar1) {
    this_local._7_1_ =
         ids_iter.
         super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
         ._M_cur._7_1_ & 1;
  }
  else {
    ppVar6 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false,_false>
                           *)&local_38);
    this_05 = &ppVar6->second;
    insts_to_kill.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)Module::context(this->module_);
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
              ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)local_68);
    bVar1 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ::empty(&(ppVar6->second).decorate_insts);
    __end2 = std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             begin(&this_05->direct_decorations);
    inst = (Instruction *)
           std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ::end(&this_05->direct_decorations);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                       *)&inst), bVar2) {
      ppIVar17 = __gnu_cxx::
                 __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                 ::operator*(&__end2);
      indirect_decorations_to_remove._M_h._M_single_bucket = (__node_base_ptr)*ppIVar17;
      bVar2 = std::function<bool_(const_spvtools::opt::Instruction_&)>::operator()
                        (pred,(Instruction *)indirect_decorations_to_remove._M_h._M_single_bucket);
      if (bVar2) {
        std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
        push_back((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   *)local_68,(value_type *)&indirect_decorations_to_remove._M_h._M_single_bucket);
      }
      __gnu_cxx::
      __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
      ::operator++(&__end2);
    }
    std::
    unordered_set<const_spvtools::opt::Instruction_*,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<const_spvtools::opt::Instruction_*>_>
    ::unordered_set((unordered_set<const_spvtools::opt::Instruction_*,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<const_spvtools::opt::Instruction_*>_>
                     *)&__range2_1);
    pvVar7 = &(ppVar6->second).indirect_decorations;
    __end2_1 = std::
               vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
               begin(pvVar7);
    inst_1 = (Instruction *)
             std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             end(pvVar7);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                               *)&inst_1), bVar2) {
      ppIVar17 = __gnu_cxx::
                 __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                 ::operator*(&__end2_1);
      group_decorations_to_keep.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppIVar17;
      OVar3 = opt::Instruction::opcode
                        ((Instruction *)
                         group_decorations_to_keep.
                         super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar2 = true;
      if (OVar3 != OpGroupDecorate) {
        OVar3 = opt::Instruction::opcode
                          ((Instruction *)
                           group_decorations_to_keep.
                           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar2 = OVar3 == OpGroupMemberDecorate;
      }
      if (!bVar2) {
        __assert_fail("inst->opcode() == spv::Op::OpGroupDecorate || inst->opcode() == spv::Op::OpGroupMemberDecorate"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/decoration_manager.cpp"
                      ,0x4f,
                      "bool spvtools::opt::analysis::DecorationManager::RemoveDecorationsFrom(uint32_t, std::function<bool (const Instruction &)>)"
                     );
      }
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             local_100);
      group_iter.
      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
      ._M_cur._4_4_ =
           opt::Instruction::GetSingleWordInOperand
                     ((Instruction *)
                      group_decorations_to_keep.
                      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
      local_110._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>_>
           ::find(&this->id_to_decoration_insts_,
                  (key_type *)
                  ((long)&group_iter.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                          ._M_cur + 4));
      group_decorations =
           (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
           std::
           unordered_map<unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>_>
           ::end(&this->id_to_decoration_insts_);
      bVar2 = std::__detail::operator!=
                        (&local_110,
                         (_Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                          *)&group_decorations);
      if (!bVar2) {
        __assert_fail("group_iter != id_to_decoration_insts_.end() && \"Unknown decoration group\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/decoration_manager.cpp"
                      ,0x55,
                      "bool spvtools::opt::analysis::DecorationManager::RemoveDecorationsFrom(uint32_t, std::function<bool (const Instruction &)>)"
                     );
      }
      ppVar8 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false,_false>
                             *)&local_110);
      this_03 = &ppVar8->second;
      __end3 = std::
               vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
               begin(&this_03->direct_decorations);
      decoration = (Instruction *)
                   std::
                   vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   ::end(&this_03->direct_decorations);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                         *)&decoration), bVar2) {
        ppIVar9 = __gnu_cxx::
                  __normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                  ::operator*(&__end3);
        _stride = *ppIVar9;
        bVar2 = std::function<bool_(const_spvtools::opt::Instruction_&)>::operator()(pred,_stride);
        if (!bVar2) {
          std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
          push_back((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     *)local_100,(value_type *)&stride);
        }
        __gnu_cxx::
        __normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
        ::operator++(&__end3);
      }
      sVar10 = std::
               vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
               size((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     *)local_100);
      sVar11 = std::
               vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
               size(&this_03->direct_decorations);
      if ((sVar10 != sVar11) ||
         (sVar10 = std::
                   vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   ::size(&this_03->direct_decorations), sVar10 == 0)) {
        OVar3 = opt::Instruction::opcode
                          ((Instruction *)
                           group_decorations_to_keep.
                           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        iVar4 = 2;
        if (OVar3 == OpGroupDecorate) {
          iVar4 = 1;
        }
        local_14c = 1;
        while (uVar5 = opt::Instruction::NumInOperands
                                 ((Instruction *)
                                  group_decorations_to_keep.
                                  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage),
              local_14c < uVar5) {
          uVar5 = opt::Instruction::GetSingleWordInOperand
                            ((Instruction *)
                             group_decorations_to_keep.
                             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,local_14c);
          if (uVar5 == pred_local._4_4_) {
            uVar5 = opt::Instruction::NumInOperands
                              ((Instruction *)
                               group_decorations_to_keep.
                               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
            index = uVar5 - iVar4;
            if (local_14c < index) {
              pOVar12 = opt::Instruction::GetInOperand
                                  ((Instruction *)
                                   group_decorations_to_keep.
                                   super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,index);
              pOVar13 = opt::Instruction::GetInOperand
                                  ((Instruction *)
                                   group_decorations_to_keep.
                                   super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,local_14c);
              Operand::operator=(pOVar13,pOVar12);
            }
            if (iVar4 == 2) {
              if (local_14c < index) {
                pOVar12 = opt::Instruction::GetInOperand
                                    ((Instruction *)
                                     group_decorations_to_keep.
                                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,index + 1);
                pOVar13 = opt::Instruction::GetInOperand
                                    ((Instruction *)
                                     group_decorations_to_keep.
                                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     local_14c + 1);
                Operand::operator=(pOVar13,pOVar12);
              }
              opt::Instruction::RemoveInOperand
                        ((Instruction *)
                         group_decorations_to_keep.
                         super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,index + 1);
            }
            opt::Instruction::RemoveInOperand
                      ((Instruction *)
                       group_decorations_to_keep.
                       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,index);
            ids_iter.
            super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
            ._M_cur._7_1_ = 1;
          }
          else {
            local_14c = iVar4 + local_14c;
          }
        }
        uVar5 = opt::Instruction::NumInOperands
                          ((Instruction *)
                           group_decorations_to_keep.
                           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (uVar5 == 1) {
          std::
          unordered_set<spvtools::opt::Instruction_const*,std::hash<spvtools::opt::Instruction_const*>,std::equal_to<spvtools::opt::Instruction_const*>,std::allocator<spvtools::opt::Instruction_const*>>
          ::emplace<spvtools::opt::Instruction*&>
                    ((unordered_set<spvtools::opt::Instruction_const*,std::hash<spvtools::opt::Instruction_const*>,std::equal_to<spvtools::opt::Instruction_const*>,std::allocator<spvtools::opt::Instruction_const*>>
                      *)&__range2_1,
                     (Instruction **)
                     &group_decorations_to_keep.
                      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
          push_back((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     *)local_68,
                    (value_type *)
                    &group_decorations_to_keep.
                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else if ((ids_iter.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                  ._M_cur._7_1_ & 1) != 0) {
          IRContext::ForgetUses
                    ((IRContext *)
                     insts_to_kill.
                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (Instruction *)
                     group_decorations_to_keep.
                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          unordered_set<spvtools::opt::Instruction_const*,std::hash<spvtools::opt::Instruction_const*>,std::equal_to<spvtools::opt::Instruction_const*>,std::allocator<spvtools::opt::Instruction_const*>>
          ::emplace<spvtools::opt::Instruction*&>
                    ((unordered_set<spvtools::opt::Instruction_const*,std::hash<spvtools::opt::Instruction_const*>,std::equal_to<spvtools::opt::Instruction_const*>,std::allocator<spvtools::opt::Instruction_const*>>
                      *)&__range2_1,
                     (Instruction **)
                     &group_decorations_to_keep.
                      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          IRContext::AnalyzeUses
                    ((IRContext *)
                     insts_to_kill.
                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (Instruction *)
                     group_decorations_to_keep.
                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        bVar2 = std::
                vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ::empty((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                         *)local_100);
        if (!bVar2) {
          __end4 = std::
                   vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   ::begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                            *)local_100);
          decoration_1 = (Instruction *)
                         std::
                         vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                         ::end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                *)local_100);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                             *)&decoration_1), bVar2) {
            p_Var14 = (__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                       *)__gnu_cxx::
                         __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                         ::operator*(&__end4);
            this_00._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = p_Var14->_M_t
            ;
            new_inst._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
                 (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
                  )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
                    )this_00;
            c = Module::context(this->module_);
            pIVar15 = opt::Instruction::Clone
                                ((Instruction *)
                                 this_00._M_t.
                                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                                 _M_head_impl,c);
            std::
            unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
            unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
                      ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                        *)&local_198,pIVar15);
            this_04 = std::
                      unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      ::operator->(&local_198);
            local_1d4 = pred_local._4_4_;
            local_1d0 = (_func_int **)&local_1d4;
            local_1c8 = (_func_int **)0x1;
            init_list._M_len = 1;
            init_list._M_array = (iterator)local_1d0;
            utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1c0,init_list);
            opt::Instruction::SetInOperand(this_04,0,&local_1c0);
            utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1c0);
            this_01 = this->module_;
            std::
            unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ::unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                          *)&decoration_iter,&local_198);
            Module::AddAnnotationInst
                      (this_01,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                *)&decoration_iter);
            std::
            unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ::~unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                           *)&decoration_iter);
            Module::annotation_end((Module *)&indirect_decorations);
            piVar16 = InstructionList::iterator::operator--((iterator *)&indirect_decorations);
            InstructionList::iterator::iterator((iterator *)&local_1e8,piVar16);
            this_02 = insts_to_kill.
                      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pIVar15 = utils::IntrusiveList<spvtools::opt::Instruction>::
                      iterator_template<spvtools::opt::Instruction>::operator*(&local_1e8);
            IRContext::AnalyzeUses((IRContext *)this_02,pIVar15);
            std::
            unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ::~unique_ptr(&local_198);
            __gnu_cxx::
            __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
            ::operator++(&__end4);
          }
        }
      }
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *
              )local_100);
      __gnu_cxx::
      __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
      ::operator++(&__end2_1);
    }
    pvVar7 = &(ppVar6->second).indirect_decorations;
    local_1f8 = pvVar7;
    local_210._M_current =
         (Instruction **)
         std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
         begin(pvVar7);
    local_218 = (Instruction **)
                std::
                vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ::end(local_1f8);
    local_220 = (unordered_set<const_spvtools::opt::Instruction_*,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<const_spvtools::opt::Instruction_*>_>
                 *)&__range2_1;
    local_208 = std::
                remove_if<__gnu_cxx::__normal_iterator<spvtools::opt::Instruction**,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>,spvtools::opt::analysis::DecorationManager::RemoveDecorationsFrom(unsigned_int,std::function<bool(spvtools::opt::Instruction_const&)>)::__0>
                          (local_210,
                           (__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                            )local_218,(anon_class_8_1_ee9ee759_for__M_pred)local_220);
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Instruction*const*,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>
    ::__normal_iterator<spvtools::opt::Instruction**>
              ((__normal_iterator<spvtools::opt::Instruction*const*,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>
                *)&local_200,&local_208);
    local_230._M_current =
         (Instruction **)
         std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
         end(local_1f8);
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Instruction*const*,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>
    ::__normal_iterator<spvtools::opt::Instruction**>
              ((__normal_iterator<spvtools::opt::Instruction*const*,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>
                *)&local_228,&local_230);
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::erase
              (pvVar7,local_200,local_228);
    bVar2 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ::empty((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     *)local_68);
    ids_iter.
    super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
    ._M_cur._7_1_ =
         (ids_iter.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
          ._M_cur._7_1_ & 1) != 0 || ((bVar2 ^ 0xffU) & 1) != 0;
    __end2_2 = std::
               vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
               begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      *)local_68);
    inst_2 = (Instruction *)
             std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)local_68);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                               *)&inst_2), bVar2) {
      ppIVar17 = __gnu_cxx::
                 __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                 ::operator*(&__end2_2);
      IRContext::KillInst((IRContext *)
                          insts_to_kill.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,*ppIVar17);
      __gnu_cxx::
      __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
      ::operator++(&__end2_2);
    }
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::clear
              ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)local_68);
    if (((((bVar1 ^ 0xffU) & 1) != 0) &&
        (bVar1 = std::
                 vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 ::empty(&this_05->direct_decorations), bVar1)) &&
       (bVar1 = std::
                vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ::empty(&(ppVar6->second).indirect_decorations), bVar1)) {
      pvVar7 = &(ppVar6->second).decorate_insts;
      __end3_1 = std::
                 vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 ::begin(pvVar7);
      inst_3 = (Instruction *)
               std::
               vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
               end(pvVar7);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                 *)&inst_3), bVar1) {
        ppIVar17 = __gnu_cxx::
                   __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                   ::operator*(&__end3_1);
        __range2_3 = (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      *)*ppIVar17;
        std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
        push_back((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   *)local_68,(value_type *)&__range2_3);
        __gnu_cxx::
        __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
        ::operator++(&__end3_1);
      }
    }
    bVar1 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ::empty((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     *)local_68);
    ids_iter.
    super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
    ._M_cur._7_1_ =
         (ids_iter.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
          ._M_cur._7_1_ & 1) != 0 || ((bVar1 ^ 0xffU) & 1) != 0;
    __end2_3 = std::
               vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
               begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      *)local_68);
    inst_4 = (Instruction *)
             std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)local_68);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_3,
                              (__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                               *)&inst_4), bVar1) {
      ppIVar17 = __gnu_cxx::
                 __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                 ::operator*(&__end2_3);
      IRContext::KillInst((IRContext *)
                          insts_to_kill.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,*ppIVar17);
      __gnu_cxx::
      __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
      ::operator++(&__end2_3);
    }
    bVar1 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ::empty(&this_05->direct_decorations);
    if (((bVar1) &&
        (bVar1 = std::
                 vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 ::empty(&(ppVar6->second).indirect_decorations), bVar1)) &&
       (bVar1 = std::
                vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ::empty(&(ppVar6->second).decorate_insts), bVar1)) {
      std::
      unordered_map<unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>_>
      ::erase(&this->id_to_decoration_insts_,(iterator)local_38._M_cur);
    }
    this_local._7_1_ =
         ids_iter.
         super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
         ._M_cur._7_1_ & 1;
    std::
    unordered_set<const_spvtools::opt::Instruction_*,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<const_spvtools::opt::Instruction_*>_>
    ::~unordered_set((unordered_set<const_spvtools::opt::Instruction_*,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<const_spvtools::opt::Instruction_*>_>
                      *)&__range2_1);
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
            local_68);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool DecorationManager::RemoveDecorationsFrom(
    uint32_t id, std::function<bool(const Instruction&)> pred) {
  bool was_modified = false;
  const auto ids_iter = id_to_decoration_insts_.find(id);
  if (ids_iter == id_to_decoration_insts_.end()) {
    return was_modified;
  }

  TargetData& decorations_info = ids_iter->second;
  auto context = module_->context();
  std::vector<Instruction*> insts_to_kill;
  const bool is_group = !decorations_info.decorate_insts.empty();

  // Schedule all direct decorations for removal if instructed as such by
  // |pred|.
  for (Instruction* inst : decorations_info.direct_decorations)
    if (pred(*inst)) insts_to_kill.push_back(inst);

  // For all groups being directly applied to |id|, remove |id| (and the
  // literal if |inst| is an OpGroupMemberDecorate) from the instruction
  // applying the group.
  std::unordered_set<const Instruction*> indirect_decorations_to_remove;
  for (Instruction* inst : decorations_info.indirect_decorations) {
    assert(inst->opcode() == spv::Op::OpGroupDecorate ||
           inst->opcode() == spv::Op::OpGroupMemberDecorate);

    std::vector<Instruction*> group_decorations_to_keep;
    const uint32_t group_id = inst->GetSingleWordInOperand(0u);
    const auto group_iter = id_to_decoration_insts_.find(group_id);
    assert(group_iter != id_to_decoration_insts_.end() &&
           "Unknown decoration group");
    const auto& group_decorations = group_iter->second.direct_decorations;
    for (Instruction* decoration : group_decorations) {
      if (!pred(*decoration)) group_decorations_to_keep.push_back(decoration);
    }

    // If all decorations should be kept, then we can keep |id| part of the
    // group.  However, if the group itself has no decorations, we should remove
    // the id from the group.  This is needed to make |KillNameAndDecorate| work
    // correctly when a decoration group has no decorations.
    if (group_decorations_to_keep.size() == group_decorations.size() &&
        group_decorations.size() != 0) {
      continue;
    }

    // Otherwise, remove |id| from the targets of |group_id|
    const uint32_t stride =
        inst->opcode() == spv::Op::OpGroupDecorate ? 1u : 2u;
    for (uint32_t i = 1u; i < inst->NumInOperands();) {
      if (inst->GetSingleWordInOperand(i) != id) {
        i += stride;
        continue;
      }

      const uint32_t last_operand_index = inst->NumInOperands() - stride;
      if (i < last_operand_index)
        inst->GetInOperand(i) = inst->GetInOperand(last_operand_index);
      // Remove the associated literal, if it exists.
      if (stride == 2u) {
        if (i < last_operand_index)
          inst->GetInOperand(i + 1u) =
              inst->GetInOperand(last_operand_index + 1u);
        inst->RemoveInOperand(last_operand_index + 1u);
      }
      inst->RemoveInOperand(last_operand_index);
      was_modified = true;
    }

    // If the instruction has no targets left, remove the instruction
    // altogether.
    if (inst->NumInOperands() == 1u) {
      indirect_decorations_to_remove.emplace(inst);
      insts_to_kill.push_back(inst);
    } else if (was_modified) {
      context->ForgetUses(inst);
      indirect_decorations_to_remove.emplace(inst);
      context->AnalyzeUses(inst);
    }

    // If only some of the decorations should be kept, clone them and apply
    // them directly to |id|.
    if (!group_decorations_to_keep.empty()) {
      for (Instruction* decoration : group_decorations_to_keep) {
        // simply clone decoration and change |group_id| to |id|
        std::unique_ptr<Instruction> new_inst(
            decoration->Clone(module_->context()));
        new_inst->SetInOperand(0, {id});
        module_->AddAnnotationInst(std::move(new_inst));
        auto decoration_iter = --module_->annotation_end();
        context->AnalyzeUses(&*decoration_iter);
      }
    }
  }

  auto& indirect_decorations = decorations_info.indirect_decorations;
  indirect_decorations.erase(
      std::remove_if(
          indirect_decorations.begin(), indirect_decorations.end(),
          [&indirect_decorations_to_remove](const Instruction* inst) {
            return indirect_decorations_to_remove.count(inst);
          }),
      indirect_decorations.end());

  was_modified |= !insts_to_kill.empty();
  for (Instruction* inst : insts_to_kill) context->KillInst(inst);
  insts_to_kill.clear();

  // Schedule all instructions applying the group for removal if this group no
  // longer applies decorations, either directly or indirectly.
  if (is_group && decorations_info.direct_decorations.empty() &&
      decorations_info.indirect_decorations.empty()) {
    for (Instruction* inst : decorations_info.decorate_insts)
      insts_to_kill.push_back(inst);
  }
  was_modified |= !insts_to_kill.empty();
  for (Instruction* inst : insts_to_kill) context->KillInst(inst);

  if (decorations_info.direct_decorations.empty() &&
      decorations_info.indirect_decorations.empty() &&
      decorations_info.decorate_insts.empty()) {
    id_to_decoration_insts_.erase(ids_iter);
  }
  return was_modified;
}